

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.cpp
# Opt level: O1

string * get_abi_cxx11_(string *__return_storage_ptr__,node *table,char *key)

{
  int iVar1;
  uint uVar2;
  allocator local_19;
  
  iVar1 = lookup(table,key);
  if (iVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"CANNOT GET VALUE","");
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EE bla",6);
    uVar2 = hash(key,0x1e);
    std::__cxx11::string::string((string *)__return_storage_ptr__,table[uVar2].data,&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get(node *table,const char* key){
    if(lookup(table, key)){
        std::cout <<"EE bla";
        unsigned index = hash(key, TABLESIZE);
        //const node *it = table[index];

        //std::cout << "\nin get func > " << it->data <<'\n';

        // Попытка установить наличие соответствующего ключа в связанном списке
/*
        while(it != NULL && strcmp(it->key, key) != 0)
        {
            it = it->next;
        }*/
        //std::cout << "\nin get func > " << it->data <<'\n';
        return table[index].data;

    }
    return "CANNOT GET VALUE";
}